

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  undefined4 uVar1;
  code *pcVar2;
  Instruction IVar3;
  randomx_cache *cache;
  JitCompilerX86 *pJVar4;
  uint8_t *puVar5;
  randomx_cache *this;
  size_type sVar6;
  ulong uVar7;
  undefined1 *__n;
  undefined1 *puVar8;
  long unaff_RBP;
  randomx_cache *__s;
  ulong uVar9;
  
  puVar8 = &stack0xffffffffffffffd8;
  IVar3 = (Instruction)randomx::selectArgonImpl(flags);
  if (IVar3 == (Instruction)0x0) {
    return (randomx_cache *)0x0;
  }
  cache = (randomx_cache *)operator_new(0x83a8);
  this = (randomx_cache *)&(cache->cacheKey).field_2;
  __s = cache;
  memset(cache,0,0x83a0);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)this;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = (randomx_argon2_impl *)IVar3;
  uVar9 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  uVar7 = (long)&switchD_00110d31::switchdataD_0011f940 +
          (long)(int)(&switchD_00110d31::switchdataD_0011f940)[uVar9];
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar5 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar5 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    break;
  default:
    operator_delete(this);
    if ((int)__n == 1) {
      __cxa_begin_catch(&switchD_00110d31::switchdataD_0011f940);
      if (cache != (randomx_cache *)0x0) {
        randomx_release_cache(cache);
      }
      __cxa_end_catch();
      return (randomx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_00110d31::switchdataD_0011f940);
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar4 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar4);
    cache->jit = pJVar4;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar4->code;
    puVar5 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar4 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar4);
    cache->jit = pJVar4;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar4->code;
    puVar5 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if (uVar7 < 2) {
      return (randomx_cache *)(ulong)*(uint *)&__s->memory;
    }
    memset(__s,0,(size_t)__n);
    cache[1].programs[0].programBuffer[0x139] = IVar3;
    cache[1].programs[0].programBuffer[0x13b].opcode = '\0';
    *(undefined ***)this = &PTR__VmBase_00126fd8;
    goto LAB_00111372;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = (char)uVar7 + '\x14';
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    *__n = *__n;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + '@';
    lutDec3._1014_4_ = 0x5c6cd571;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    *__n = *__n;
    this = (randomx_cache *)CONCAT71(0x11f9,(char)(uVar7 >> 8) + '@');
    puVar8 = &stack0xffffffffffffffe0;
    uVar1 = LocalDescriptorTableRegister();
    *(undefined4 *)&this->memory = uVar1;
    memset(this,0,0xac0);
    randomx::CompiledLightVm<randomx::LargePageAllocator,_false,_false>::CompiledLightVm
              ((CompiledLightVm<randomx::LargePageAllocator,_false,_false> *)this);
LAB_00111372:
    sVar6 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this->memory)->_M_allocated_capacity;
    if (uVar9 != 0) {
      pcVar2 = *(code **)(sVar6 + 0x30);
      *(undefined8 *)(puVar8 + -8) = 0x111387;
      (*pcVar2)(this,uVar9);
      *(undefined8 *)(puVar8 + -8) = 0x11139d;
      std::__cxx11::string::_M_assign((string *)(this->programs[0].programBuffer + 0x13c));
      sVar6 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&this->memory)->_M_allocated_capacity;
    }
    if (cache != (randomx_cache *)0x0) {
      pcVar2 = *(code **)(sVar6 + 0x28);
      *(undefined8 *)(puVar8 + -8) = 0x1113ae;
      (*pcVar2)(this,cache);
      sVar6 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&this->memory)->_M_allocated_capacity;
    }
    pcVar2 = *(code **)(sVar6 + 0x10);
    *(undefined8 *)(puVar8 + -8) = 0x1113b7;
    (*pcVar2)(this);
    return this;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = (char)uVar7 + '\x14';
    halt_baddata();
  }
  cache->memory = puVar5;
  return cache;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}